

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O1

int vorbis_analysis_headerout
              (vorbis_dsp_state *v,vorbis_comment *vc,ogg_packet *op,ogg_packet *op_comm,
              ogg_packet *op_code)

{
  vorbis_info *pvVar1;
  long *plVar2;
  uchar *puVar3;
  int iVar4;
  size_t sVar5;
  void *pvVar6;
  void *pvVar7;
  long lVar8;
  oggpack_buffer opb;
  oggpack_buffer local_60;
  long *local_38;
  
  pvVar1 = v->vi;
  pvVar7 = v->backend_state;
  iVar4 = -0x81;
  if ((pvVar7 == (void *)0x0) || (pvVar1->channels - 0x101U < 0xffffff00)) {
    pvVar7 = (void *)0x0;
  }
  else {
    oggpack_writeinit(&local_60);
    plVar2 = (long *)pvVar1->codec_setup;
    if (((plVar2 != (long *)0x0) && (0x3f < *plVar2)) && (*plVar2 <= plVar2[1])) {
      local_38 = plVar2;
      oggpack_write(&local_60,1,8);
      lVar8 = 0;
      do {
        oggpack_write(&local_60,(long)"vorbis"[lVar8],8);
        lVar8 = lVar8 + 1;
      } while ((int)lVar8 != 6);
      oggpack_write(&local_60,0,0x20);
      oggpack_write(&local_60,(long)pvVar1->channels,8);
      oggpack_write(&local_60,pvVar1->rate,0x20);
      oggpack_write(&local_60,pvVar1->bitrate_upper,0x20);
      oggpack_write(&local_60,pvVar1->bitrate_nominal,0x20);
      oggpack_write(&local_60,pvVar1->bitrate_lower,0x20);
      plVar2 = local_38;
      iVar4 = ov_ilog((int)*local_38 - 1);
      oggpack_write(&local_60,(long)iVar4,4);
      iVar4 = ov_ilog((int)plVar2[1] - 1);
      oggpack_write(&local_60,(long)iVar4,4);
      oggpack_write(&local_60,1,1);
      if (*(void **)((long)pvVar7 + 0x78) != (void *)0x0) {
        free(*(void **)((long)pvVar7 + 0x78));
      }
      sVar5 = oggpack_bytes(&local_60);
      pvVar6 = malloc(sVar5);
      puVar3 = local_60.buffer;
      *(void **)((long)pvVar7 + 0x78) = pvVar6;
      sVar5 = oggpack_bytes(&local_60);
      memcpy(pvVar6,puVar3,sVar5);
      op->packet = *(uchar **)((long)pvVar7 + 0x78);
      lVar8 = oggpack_bytes(&local_60);
      op->bytes = lVar8;
      op->b_o_s = 1;
      op->e_o_s = 0;
      op->granulepos = 0;
      op->packetno = 0;
      oggpack_reset(&local_60);
      _vorbis_pack_comment(&local_60,vc);
      if (*(void **)((long)pvVar7 + 0x80) != (void *)0x0) {
        free(*(void **)((long)pvVar7 + 0x80));
      }
      sVar5 = oggpack_bytes(&local_60);
      pvVar6 = malloc(sVar5);
      puVar3 = local_60.buffer;
      *(void **)((long)pvVar7 + 0x80) = pvVar6;
      sVar5 = oggpack_bytes(&local_60);
      memcpy(pvVar6,puVar3,sVar5);
      op_comm->packet = *(uchar **)((long)pvVar7 + 0x80);
      lVar8 = oggpack_bytes(&local_60);
      op_comm->bytes = lVar8;
      op_comm->b_o_s = 0;
      op_comm->e_o_s = 0;
      op_comm->granulepos = 0;
      op_comm->packetno = 1;
      oggpack_reset(&local_60);
      pvVar6 = pvVar1->codec_setup;
      if (pvVar6 != (void *)0x0) {
        oggpack_write(&local_60,5,8);
        lVar8 = 0;
        do {
          oggpack_write(&local_60,(long)"vorbis"[lVar8],8);
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 != 6);
        oggpack_write(&local_60,(long)*(int *)((long)pvVar6 + 0x20) - 1,8);
        if (0 < *(int *)((long)pvVar6 + 0x20)) {
          lVar8 = 0;
          do {
            iVar4 = vorbis_staticbook_pack
                              (*(static_codebook **)((long)pvVar6 + lVar8 * 8 + 0xb28),&local_60);
            if (iVar4 != 0) goto LAB_001d8780;
            lVar8 = lVar8 + 1;
          } while (lVar8 < *(int *)((long)pvVar6 + 0x20));
        }
        oggpack_write(&local_60,0,6);
        oggpack_write(&local_60,0,0x10);
        oggpack_write(&local_60,(long)*(int *)((long)pvVar6 + 0x18) - 1,6);
        if (0 < *(int *)((long)pvVar6 + 0x18)) {
          lVar8 = 0;
          do {
            oggpack_write(&local_60,(long)*(int *)((long)pvVar6 + lVar8 * 4 + 0x528),0x10);
            if (_floor_P[*(int *)((long)pvVar6 + lVar8 * 4 + 0x528)]->pack ==
                (_func_void_vorbis_info_floor_ptr_oggpack_buffer_ptr *)0x0) goto LAB_001d8780;
            (*_floor_P[*(int *)((long)pvVar6 + lVar8 * 4 + 0x528)]->pack)
                      (*(vorbis_info_floor **)((long)pvVar6 + lVar8 * 8 + 0x628),&local_60);
            lVar8 = lVar8 + 1;
          } while (lVar8 < *(int *)((long)pvVar6 + 0x18));
        }
        oggpack_write(&local_60,(long)*(int *)((long)pvVar6 + 0x1c) - 1,6);
        if (0 < *(int *)((long)pvVar6 + 0x1c)) {
          lVar8 = 0;
          do {
            oggpack_write(&local_60,(long)*(int *)((long)pvVar6 + lVar8 * 4 + 0x828),0x10);
            (*_residue_P[*(int *)((long)pvVar6 + lVar8 * 4 + 0x828)]->pack)
                      (*(vorbis_info_residue **)((long)pvVar6 + lVar8 * 8 + 0x928),&local_60);
            lVar8 = lVar8 + 1;
          } while (lVar8 < *(int *)((long)pvVar6 + 0x1c));
        }
        oggpack_write(&local_60,(long)*(int *)((long)pvVar6 + 0x14) - 1,6);
        if (0 < *(int *)((long)pvVar6 + 0x14)) {
          lVar8 = 0;
          do {
            oggpack_write(&local_60,(long)*(int *)((long)pvVar6 + lVar8 * 4 + 0x228),0x10);
            (*_mapping_P[*(int *)((long)pvVar6 + lVar8 * 4 + 0x228)]->pack)
                      (pvVar1,*(vorbis_info_mapping **)((long)pvVar6 + lVar8 * 8 + 0x328),&local_60)
            ;
            lVar8 = lVar8 + 1;
          } while (lVar8 < *(int *)((long)pvVar6 + 0x14));
        }
        oggpack_write(&local_60,(long)*(int *)((long)pvVar6 + 0x10) - 1,6);
        if (0 < *(int *)((long)pvVar6 + 0x10)) {
          lVar8 = 0;
          do {
            oggpack_write(&local_60,(long)**(int **)((long)pvVar6 + lVar8 * 8 + 0x28),1);
            oggpack_write(&local_60,(long)*(int *)(*(long *)((long)pvVar6 + lVar8 * 8 + 0x28) + 4),
                          0x10);
            oggpack_write(&local_60,(long)*(int *)(*(long *)((long)pvVar6 + lVar8 * 8 + 0x28) + 8),
                          0x10);
            oggpack_write(&local_60,(long)*(int *)(*(long *)((long)pvVar6 + lVar8 * 8 + 0x28) + 0xc)
                          ,8);
            lVar8 = lVar8 + 1;
          } while (lVar8 < *(int *)((long)pvVar6 + 0x10));
        }
        oggpack_write(&local_60,1,1);
        if (*(void **)((long)pvVar7 + 0x88) != (void *)0x0) {
          free(*(void **)((long)pvVar7 + 0x88));
        }
        sVar5 = oggpack_bytes(&local_60);
        pvVar6 = malloc(sVar5);
        *(void **)((long)pvVar7 + 0x88) = pvVar6;
        sVar5 = oggpack_bytes(&local_60);
        memcpy(pvVar6,local_60.buffer,sVar5);
        op_code->packet = *(uchar **)((long)pvVar7 + 0x88);
        lVar8 = oggpack_bytes(&local_60);
        op_code->bytes = lVar8;
        op_code->b_o_s = 0;
        op_code->e_o_s = 0;
        op_code->granulepos = 0;
        op_code->packetno = 2;
        oggpack_writeclear(&local_60);
        return 0;
      }
    }
LAB_001d8780:
    iVar4 = -0x82;
  }
  op->granulepos = 0;
  op->packetno = 0;
  op->b_o_s = 0;
  op->e_o_s = 0;
  op->packet = (uchar *)0x0;
  op->bytes = 0;
  op_comm->granulepos = 0;
  op_comm->packetno = 0;
  op_comm->b_o_s = 0;
  op_comm->e_o_s = 0;
  op_comm->packet = (uchar *)0x0;
  op_comm->bytes = 0;
  op_code->granulepos = 0;
  op_code->packetno = 0;
  op_code->b_o_s = 0;
  op_code->e_o_s = 0;
  op_code->packet = (uchar *)0x0;
  op_code->bytes = 0;
  if (pvVar7 != (void *)0x0) {
    if (0 < pvVar1->channels) {
      oggpack_writeclear(&local_60);
    }
    if (*(void **)((long)pvVar7 + 0x78) != (void *)0x0) {
      free(*(void **)((long)pvVar7 + 0x78));
    }
    if (*(void **)((long)pvVar7 + 0x80) != (void *)0x0) {
      free(*(void **)((long)pvVar7 + 0x80));
    }
    if (*(void **)((long)pvVar7 + 0x88) != (void *)0x0) {
      free(*(void **)((long)pvVar7 + 0x88));
    }
    *(undefined8 *)((long)pvVar7 + 0x78) = 0;
    *(undefined8 *)((long)pvVar7 + 0x80) = 0;
    *(undefined8 *)((long)pvVar7 + 0x88) = 0;
  }
  return iVar4;
}

Assistant:

int vorbis_analysis_headerout(vorbis_dsp_state *v,
                              vorbis_comment *vc,
                              ogg_packet *op,
                              ogg_packet *op_comm,
                              ogg_packet *op_code){
  int ret=OV_EIMPL;
  vorbis_info *vi=v->vi;
  oggpack_buffer opb;
  private_state *b=v->backend_state;

  if(!b||vi->channels<=0||vi->channels>256){
    b = NULL;
    ret=OV_EFAULT;
    goto err_out;
  }

  /* first header packet **********************************************/

  oggpack_writeinit(&opb);
  if(_vorbis_pack_info(&opb,vi))goto err_out;

  /* build the packet */
  if(b->header)_ogg_free(b->header);
  b->header=_ogg_malloc(oggpack_bytes(&opb));
  memcpy(b->header,opb.buffer,oggpack_bytes(&opb));
  op->packet=b->header;
  op->bytes=oggpack_bytes(&opb);
  op->b_o_s=1;
  op->e_o_s=0;
  op->granulepos=0;
  op->packetno=0;

  /* second header packet (comments) **********************************/

  oggpack_reset(&opb);
  if(_vorbis_pack_comment(&opb,vc))goto err_out;

  if(b->header1)_ogg_free(b->header1);
  b->header1=_ogg_malloc(oggpack_bytes(&opb));
  memcpy(b->header1,opb.buffer,oggpack_bytes(&opb));
  op_comm->packet=b->header1;
  op_comm->bytes=oggpack_bytes(&opb);
  op_comm->b_o_s=0;
  op_comm->e_o_s=0;
  op_comm->granulepos=0;
  op_comm->packetno=1;

  /* third header packet (modes/codebooks) ****************************/

  oggpack_reset(&opb);
  if(_vorbis_pack_books(&opb,vi))goto err_out;

  if(b->header2)_ogg_free(b->header2);
  b->header2=_ogg_malloc(oggpack_bytes(&opb));
  memcpy(b->header2,opb.buffer,oggpack_bytes(&opb));
  op_code->packet=b->header2;
  op_code->bytes=oggpack_bytes(&opb);
  op_code->b_o_s=0;
  op_code->e_o_s=0;
  op_code->granulepos=0;
  op_code->packetno=2;

  oggpack_writeclear(&opb);
  return(0);
 err_out:
  memset(op,0,sizeof(*op));
  memset(op_comm,0,sizeof(*op_comm));
  memset(op_code,0,sizeof(*op_code));

  if(b){
    if(vi->channels>0)oggpack_writeclear(&opb);
    if(b->header)_ogg_free(b->header);
    if(b->header1)_ogg_free(b->header1);
    if(b->header2)_ogg_free(b->header2);
    b->header=NULL;
    b->header1=NULL;
    b->header2=NULL;
  }
  return(ret);
}